

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O3

void __thiscall DIS::ServiceRequestPdu::marshal(ServiceRequestPdu *this,DataStream *dataStream)

{
  pointer pSVar1;
  long lVar2;
  ulong uVar3;
  SupplyQuantity x;
  SupplyQuantity local_50;
  
  LogisticsFamilyPdu::marshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::marshal(&this->_requestingEntityID,dataStream);
  EntityID::marshal(&this->_servicingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_serviceTypeRequested);
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_supplies).
                                     super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_supplies).
                                    super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5));
  DataStream::operator<<(dataStream,this->_serviceRequestPadding);
  pSVar1 = (this->_supplies).
           super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_supplies).
      super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar1) {
    lVar2 = 0x18;
    uVar3 = 0;
    do {
      local_50._vptr_SupplyQuantity = (_func_int **)&PTR__SupplyQuantity_001a14d0;
      local_50._supplyType._vptr_EntityType = (_func_int **)&PTR__EntityType_0019fe40;
      local_50._supplyType._8_8_ = *(undefined8 *)((long)pSVar1 + lVar2 + -8);
      local_50._quantity = *(uchar *)((long)&pSVar1->_vptr_SupplyQuantity + lVar2);
      SupplyQuantity::marshal(&local_50,dataStream);
      SupplyQuantity::~SupplyQuantity(&local_50);
      uVar3 = uVar3 + 1;
      pSVar1 = (this->_supplies).
               super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < (ulong)((long)(this->_supplies).
                                   super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5));
  }
  return;
}

Assistant:

void ServiceRequestPdu::marshal(DataStream& dataStream) const
{
    LogisticsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _requestingEntityID.marshal(dataStream);
    _servicingEntityID.marshal(dataStream);
    dataStream << _serviceTypeRequested;
    dataStream << ( unsigned char )_supplies.size();
    dataStream << _serviceRequestPadding;

     for(size_t idx = 0; idx < _supplies.size(); idx++)
     {
        SupplyQuantity x = _supplies[idx];
        x.marshal(dataStream);
     }

}